

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void re2c::output_goto(OutputFile *o,uint32_t ind,bool *readCh,label_t to)

{
  opt_t *poVar1;
  OutputFile *pOVar2;
  string local_48;
  bool *local_28;
  bool *readCh_local;
  OutputFile *pOStack_18;
  uint32_t ind_local;
  OutputFile *o_local;
  label_t to_local;
  
  local_28 = readCh;
  readCh_local._4_4_ = ind;
  pOStack_18 = o;
  o_local._4_4_ = to.value;
  if ((*readCh & 1U) != 0) {
    poVar1 = Opt::operator->((Opt *)&opts);
    InputAPI::stmt_peek_abi_cxx11_(&local_48,&poVar1->input_api,readCh_local._4_4_);
    OutputFile::wstring(o,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    *local_28 = false;
  }
  pOVar2 = OutputFile::wind(pOStack_18,readCh_local._4_4_);
  pOVar2 = OutputFile::ws(pOVar2,"goto ");
  poVar1 = Opt::operator->((Opt *)&opts);
  pOVar2 = OutputFile::wstring(pOVar2,&poVar1->labelPrefix);
  pOVar2 = OutputFile::wlabel(pOVar2,o_local._4_4_);
  OutputFile::ws(pOVar2,";\n");
  return;
}

Assistant:

void output_goto (OutputFile & o, uint32_t ind, bool & readCh, label_t to)
{
	if (readCh)
	{
		o.wstring(opts->input_api.stmt_peek (ind));
		readCh = false;
	}
	o.wind(ind).ws("goto ").wstring(opts->labelPrefix).wlabel(to).ws(";\n");
}